

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::XmlReporter::testCaseEnded(XmlReporter *this,TestCaseStats *testCaseStats)

{
  XmlWriter *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  long lVar3;
  XmlFormatting fmt;
  ScopedElement e;
  string local_88;
  ScopedElement local_68;
  undefined1 local_58 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  
  Option<Catch::TestCaseInfo>::reset
            (&(this->super_StreamingReporterBase<Catch::XmlReporter>).currentTestCaseInfo.
              super_Option<Catch::TestCaseInfo>);
  (this->super_StreamingReporterBase<Catch::XmlReporter>).currentTestCaseInfo.used = false;
  paVar1 = &local_88.field_2;
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"OverallResult","");
  this_00 = &this->m_xml;
  fmt = (XmlFormatting)&local_88;
  XmlWriter::scopedElement((XmlWriter *)&local_38,(string *)this_00,fmt);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"success","");
  XmlWriter::writeAttribute
            ((XmlWriter *)local_38._M_allocated_capacity,&local_88,
             (testCaseStats->totals).assertions.failed == 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  iVar2 = (*(((this->super_StreamingReporterBase<Catch::XmlReporter>).m_config.
              super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_NonCopyable)._vptr_NonCopyable[0xb])();
  if (iVar2 == 1) {
    local_88._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"durationInSeconds","");
    lVar3 = std::chrono::_V2::system_clock::now();
    local_58._0_8_ = (double)((lVar3 - (this->m_testCaseTimer).m_nanoseconds) / 1000) / 1000000.0;
    XmlWriter::writeAttribute<double>
              ((XmlWriter *)local_38._M_allocated_capacity,&local_88,(double *)local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != paVar1) {
      operator_delete(local_88._M_dataplus._M_p);
    }
  }
  if ((testCaseStats->stdOut)._M_string_length != 0) {
    local_88._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"StdOut","");
    XmlWriter::scopedElement((XmlWriter *)&local_68,(string *)this_00,fmt);
    trim((string *)local_58,&testCaseStats->stdOut);
    XmlWriter::writeText(local_68.m_writer,(string *)local_58,Newline);
    if ((pointer)local_58._0_8_ != (pointer)(local_58 + 0x10)) {
      operator_delete((void *)local_58._0_8_);
    }
    XmlWriter::ScopedElement::~ScopedElement(&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != paVar1) {
      operator_delete(local_88._M_dataplus._M_p);
    }
  }
  if ((testCaseStats->stdErr)._M_string_length != 0) {
    local_88._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"StdErr","");
    XmlWriter::scopedElement((XmlWriter *)&local_68,(string *)this_00,fmt);
    trim((string *)local_58,&testCaseStats->stdErr);
    XmlWriter::writeText(local_68.m_writer,(string *)local_58,Newline);
    if ((pointer)local_58._0_8_ != (pointer)(local_58 + 0x10)) {
      operator_delete((void *)local_58._0_8_);
    }
    XmlWriter::ScopedElement::~ScopedElement(&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != paVar1) {
      operator_delete(local_88._M_dataplus._M_p);
    }
  }
  XmlWriter::endElement(this_00,Newline|Indent);
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)&local_38);
  return;
}

Assistant:

void XmlReporter::testCaseEnded( TestCaseStats const& testCaseStats ) {
        StreamingReporterBase::testCaseEnded( testCaseStats );
        XmlWriter::ScopedElement e = m_xml.scopedElement( "OverallResult" );
        e.writeAttribute( "success", testCaseStats.totals.assertions.allOk() );

        if ( m_config->showDurations() == ShowDurations::Always )
            e.writeAttribute( "durationInSeconds", m_testCaseTimer.getElapsedSeconds() );

        if( !testCaseStats.stdOut.empty() )
            m_xml.scopedElement( "StdOut" ).writeText( trim( testCaseStats.stdOut ), XmlFormatting::Newline );
        if( !testCaseStats.stdErr.empty() )
            m_xml.scopedElement( "StdErr" ).writeText( trim( testCaseStats.stdErr ), XmlFormatting::Newline );

        m_xml.endElement();
    }